

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

Result * CoreML::Model::load(Result *__return_storage_ptr__,istream *in,Model *out)

{
  bool bVar1;
  ulong uVar2;
  element_type *formatObj;
  Result local_88;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  Model *out_local;
  istream *in_local;
  Result *r;
  
  local_40._M_storage._M_storage = (uchar  [8])out;
  out_local = (Model *)in;
  in_local = (istream *)__return_storage_ptr__;
  uVar2 = std::ios::good();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"unable to open file for read",&local_41);
    Result::Result(__return_storage_ptr__,UNABLE_TO_OPEN_FILE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    local_55 = 0;
    formatObj = std::
                __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)((long)local_40._M_storage._M_storage + 8));
    loadSpecification<CoreML::Specification::Model>
              (__return_storage_ptr__,formatObj,(istream *)out_local);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      validate(&local_88,(Model *)local_40._M_storage._M_storage);
      Result::operator=(__return_storage_ptr__,&local_88);
      Result::~Result(&local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result Model::load(std::istream& in, Model& out) {
        if (!in.good()) {
            return Result(ResultType::UNABLE_TO_OPEN_FILE,
                          "unable to open file for read");
        }

        
        Result r = loadSpecification(*(out.m_spec), in);
        if (!r.good()) { return r; }
        // validate on load
        
        r = out.validate();

        return r;
    }